

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double exponential_01_cdf_inv(double cdf)

{
  double dVar1;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = log(1.0 - cdf);
    return -dVar1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"EXPONENTIAL_01_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double exponential_01_cdf_inv ( double cdf )

//****************************************************************************80
//
//  Purpose:
//
//    EXPONENTIAL_01_CDF_INV inverts the Exponential 01 CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Output, double EXPONENTIAL_CDF_INV, the corresponding argument.
//
{
  double x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "EXPONENTIAL_01_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  x = - log ( 1.0 - cdf );

  return x;
}